

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O2

void __thiscall
Assimp::IFC::ProcessBoolean
          (IFC *this,IfcBooleanResult *boolean,TempMesh *result,ConversionData *conv)

{
  undefined1 *__lhs;
  bool bVar1;
  IfcBooleanResult *pIVar2;
  IfcHalfSpaceSolid *hs;
  IfcExtrudedAreaSolid *as;
  IfcBooleanResult *this_00;
  IfcSweptAreaSolid *swept;
  IfcPolygonalBoundedHalfSpace *hs_00;
  char *unaff_retaddr;
  TempMesh first_operand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [16];
  pointer local_198;
  pointer puStack_190;
  pointer local_188;
  pointer puStack_180;
  
  pIVar2 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcBooleanResult>
                     ((Object *)(this + *(long *)(*(long *)this + -0x18)));
  if (pIVar2 == (IfcBooleanResult *)0x0) {
    STEP::Object::GetClassName_abi_cxx11_
              (&local_1c8,(Object *)(this + *(long *)(*(long *)this + -0x18)));
    std::operator+(&bStack_1e8,"skipping unknown IfcBooleanResult entity, type is ",&local_1c8);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
               &bStack_1e8);
    LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_1a8);
LAB_0050391c:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::__cxx11::string::~string((string *)&bStack_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    return;
  }
  __lhs = &(pIVar2->super_IfcGeometricRepresentationItem).field_0x30;
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs
                          ,"DIFFERENCE");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_1c8,(string *)__lhs);
    std::operator+(&bStack_1e8,"encountered unsupported boolean operator: ",&local_1c8);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
               &bStack_1e8);
    LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_1a8);
    goto LAB_0050391c;
  }
  hs = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcHalfSpaceSolid>
                 ((pIVar2->SecondOperand).
                  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,(DB *)(result->mVertcnt).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
  as = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcExtrudedAreaSolid>
                 ((pIVar2->SecondOperand).
                  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,(DB *)(result->mVertcnt).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
  if (hs == (IfcHalfSpaceSolid *)0x0 && as == (IfcExtrudedAreaSolid *)0x0) {
    LogFunctions<Assimp::IFCImporter>::LogError(unaff_retaddr);
    return;
  }
  local_188 = (pointer)0x0;
  puStack_180 = (pointer)0x0;
  local_198 = (pointer)0x0;
  puStack_190 = (pointer)0x0;
  local_1a8._0_8_ = (pointer)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  this_00 = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcBooleanResult>
                      ((pIVar2->FirstOperand).
                       super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(DB *)(result->mVertcnt).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
  if (this_00 == (IfcBooleanResult *)0x0) {
    swept = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSweptAreaSolid>
                      ((pIVar2->FirstOperand).
                       super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(DB *)(result->mVertcnt).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
    if (swept == (IfcSweptAreaSolid *)0x0) {
      LogFunctions<Assimp::IFCImporter>::LogError((char *)0x503a44);
      goto LAB_00503a44;
    }
    ProcessSweptAreaSolid(swept,(TempMesh *)local_1a8,(ConversionData *)result);
  }
  else {
    ProcessBoolean((IFC *)this_00,(IfcBooleanResult *)local_1a8,result,conv);
  }
  if (hs == (IfcHalfSpaceSolid *)0x0) {
    ProcessBooleanExtrudedAreaSolidDifference
              (as,(TempMesh *)boolean,(TempMesh *)local_1a8,(ConversionData *)result);
  }
  else {
    hs_00 = STEP::EXPRESS::DataType::
            ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcPolygonalBoundedHalfSpace>
                      ((pIVar2->SecondOperand).
                       super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(DB *)(result->mVertcnt).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
    if (hs_00 == (IfcPolygonalBoundedHalfSpace *)0x0) {
      ProcessBooleanHalfSpaceDifference(hs,(TempMesh *)boolean,(TempMesh *)local_1a8,conv);
    }
    else {
      ProcessPolygonalBoundedBooleanHalfSpaceDifference
                (hs_00,(TempMesh *)boolean,(TempMesh *)local_1a8,(ConversionData *)result);
    }
  }
LAB_00503a44:
  TempMesh::~TempMesh((TempMesh *)local_1a8);
  return;
}

Assistant:

void ProcessBoolean(const Schema_2x3::IfcBooleanResult& boolean, TempMesh& result, ConversionData& conv)
{
    // supported CSG operations:
    //   DIFFERENCE
    if(const Schema_2x3::IfcBooleanResult* const clip = boolean.ToPtr<Schema_2x3::IfcBooleanResult>()) {
        if(clip->Operator != "DIFFERENCE") {
            IFCImporter::LogWarn("encountered unsupported boolean operator: " + (std::string)clip->Operator);
            return;
        }

        // supported cases (1st operand):
        //  IfcBooleanResult -- call ProcessBoolean recursively
        //  IfcSweptAreaSolid -- obtain polygonal geometry first

        // supported cases (2nd operand):
        //  IfcHalfSpaceSolid -- easy, clip against plane
        //  IfcExtrudedAreaSolid -- reduce to an instance of the quadrify() algorithm


        const Schema_2x3::IfcHalfSpaceSolid* const hs = clip->SecondOperand->ResolveSelectPtr<Schema_2x3::IfcHalfSpaceSolid>(conv.db);
        const Schema_2x3::IfcExtrudedAreaSolid* const as = clip->SecondOperand->ResolveSelectPtr<Schema_2x3::IfcExtrudedAreaSolid>(conv.db);
        if(!hs && !as) {
            IFCImporter::LogError("expected IfcHalfSpaceSolid or IfcExtrudedAreaSolid as second clipping operand");
            return;
        }

        TempMesh first_operand;
        if(const Schema_2x3::IfcBooleanResult* const op0 = clip->FirstOperand->ResolveSelectPtr<Schema_2x3::IfcBooleanResult>(conv.db)) {
            ProcessBoolean(*op0,first_operand,conv);
        }
        else if (const Schema_2x3::IfcSweptAreaSolid* const swept = clip->FirstOperand->ResolveSelectPtr<Schema_2x3::IfcSweptAreaSolid>(conv.db)) {
            ProcessSweptAreaSolid(*swept,first_operand,conv);
        }
        else {
            IFCImporter::LogError("expected IfcSweptAreaSolid or IfcBooleanResult as first clipping operand");
            return;
        }

        if(hs) {

            const Schema_2x3::IfcPolygonalBoundedHalfSpace* const hs_bounded = clip->SecondOperand->ResolveSelectPtr<Schema_2x3::IfcPolygonalBoundedHalfSpace>(conv.db);
            if (hs_bounded) {
                ProcessPolygonalBoundedBooleanHalfSpaceDifference(hs_bounded, result, first_operand, conv);
            }
            else {
                ProcessBooleanHalfSpaceDifference(hs, result, first_operand, conv);
            }
        }
        else {
            ProcessBooleanExtrudedAreaSolidDifference(as, result, first_operand, conv);
        }
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcBooleanResult entity, type is " + boolean.GetClassName());
    }
}